

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O3

double AccumulateSSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint8_t *puVar7;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  double dVar11;
  double dVar12;
  uint8_t *local_90;
  uint8_t *local_70;
  
  uVar1 = 3;
  if (w < 3) {
    uVar1 = w;
  }
  uVar8 = 3;
  if (h < 3) {
    uVar8 = h;
  }
  uVar2 = h - 4;
  if (h < 1) {
    uVar8 = 0;
    dVar11 = 0.0;
  }
  else {
    dVar11 = 0.0;
    uVar3 = 0;
    do {
      if (0 < w) {
        iVar6 = 0;
        do {
          dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar6,uVar3,w,h);
          dVar11 = dVar11 + dVar12;
          iVar6 = iVar6 + 1;
        } while (w != iVar6);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar8);
  }
  if ((int)uVar8 < (int)uVar2) {
    uVar3 = w - 4;
    uVar5 = (ulong)uVar8;
    local_90 = ref + (uVar5 - 3) * (long)ref_stride + -3;
    local_70 = src + (uVar5 - 3) * (long)src_stride + -3;
    do {
      uVar9 = 0;
      if (0 < w) {
        do {
          dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,(int)uVar9,(int)uVar5,w,h);
          dVar11 = dVar11 + dVar12;
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
        } while (uVar1 != uVar8);
        uVar9 = (ulong)uVar1;
      }
      if ((int)uVar9 < (int)uVar3) {
        puVar10 = local_90 + uVar9;
        puVar7 = local_70 + uVar9;
        lVar4 = uVar3 - uVar9;
        do {
          dVar12 = (*VP8SSIMGet)(puVar7,src_stride,puVar10,ref_stride);
          dVar11 = dVar11 + dVar12;
          puVar10 = puVar10 + 1;
          puVar7 = puVar7 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar9 = (ulong)uVar3;
      }
      if ((int)uVar9 < w) {
        do {
          dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,(int)uVar9,(int)uVar5,w,h);
          dVar11 = dVar11 + dVar12;
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
        } while (w != uVar8);
      }
      uVar5 = uVar5 + 1;
      local_90 = local_90 + ref_stride;
      local_70 = local_70 + src_stride;
      uVar8 = uVar2;
    } while (uVar5 != uVar2);
  }
  if ((int)uVar8 < h) {
    do {
      if (0 < w) {
        iVar6 = 0;
        do {
          dVar12 = (*VP8SSIMGetClipped)(src,src_stride,ref,ref_stride,iVar6,uVar8,w,h);
          dVar11 = dVar11 + dVar12;
          iVar6 = iVar6 + 1;
        } while (w != iVar6);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != h);
  }
  return dVar11;
}

Assistant:

static double AccumulateSSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  const int w0 = (w < VP8_SSIM_KERNEL) ? w : VP8_SSIM_KERNEL;
  const int w1 = w - VP8_SSIM_KERNEL - 1;
  const int h0 = (h < VP8_SSIM_KERNEL) ? h : VP8_SSIM_KERNEL;
  const int h1 = h - VP8_SSIM_KERNEL - 1;
  int x, y;
  double sum = 0.;
  for (y = 0; y < h0; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h1; ++y) {
    for (x = 0; x < w0; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
    for (; x < w1; ++x) {
      const int off1 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * src_stride;
      const int off2 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * ref_stride;
      sum += VP8SSIMGet(src + off1, src_stride, ref + off2, ref_stride);
    }
    for (; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  return sum;
}